

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O0

void __thiscall
dlib::array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
          (array2d<dlib::rgb_alpha_pixel,_dlib::memory_manager_stateless_kernel_1<char>_> *this)

{
  memory_manager_stateless_kernel_1<dlib::rgb_alpha_pixel> *in_RDI;
  rgb_alpha_pixel *in_stack_ffffffffffffffe8;
  
  if (in_RDI[1]._vptr_memory_manager_stateless_kernel_1 != (_func_int **)0x0) {
    memory_manager_stateless_kernel_1<dlib::rgb_alpha_pixel>::deallocate_array
              (in_RDI,in_stack_ffffffffffffffe8);
    in_RDI[2]._vptr_memory_manager_stateless_kernel_1 = (_func_int **)0x0;
    in_RDI[3]._vptr_memory_manager_stateless_kernel_1 = (_func_int **)0x0;
    in_RDI[1]._vptr_memory_manager_stateless_kernel_1 = (_func_int **)0x0;
    *(undefined1 *)&in_RDI[7]._vptr_memory_manager_stateless_kernel_1 = 1;
    in_RDI[5]._vptr_memory_manager_stateless_kernel_1 = (_func_int **)0x0;
    in_RDI[6]._vptr_memory_manager_stateless_kernel_1 = (_func_int **)0x0;
  }
  return;
}

Assistant:

void clear (
        )
        {
            if (data != 0)
            {
                pool.deallocate_array(data);
                nc_ = 0;
                nr_ = 0;
                data = 0;
                at_start_ = true;
                cur = 0;
                last = 0;
            }
        }